

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void Assimp::Write(JSONWriter *out,aiAnimation *ai,bool is_elem)

{
  aiAnimation *paVar1;
  uint local_d0;
  allocator<char> local_c9;
  uint n;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  aiAnimation *paStack_18;
  bool is_elem_local;
  aiAnimation *ai_local;
  JSONWriter *out_local;
  
  local_19 = is_elem;
  paStack_18 = ai;
  ai_local = (aiAnimation *)out;
  JSONWriter::StartObj(out,is_elem);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"name",&local_41);
  JSONWriter::Key((JSONWriter *)paVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  JSONWriter::SimpleValue<aiString>((JSONWriter *)ai_local,&paStack_18->mName);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"tickspersecond",&local_79)
  ;
  JSONWriter::Key((JSONWriter *)paVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  JSONWriter::SimpleValue<double>((JSONWriter *)ai_local,&paStack_18->mTicksPerSecond);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"duration",&local_a1);
  JSONWriter::Key((JSONWriter *)paVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  JSONWriter::SimpleValue<double>((JSONWriter *)ai_local,&paStack_18->mDuration);
  paVar1 = ai_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&n,"channels",&local_c9);
  JSONWriter::Key((JSONWriter *)paVar1,(string *)&n);
  std::__cxx11::string::~string((string *)&n);
  std::allocator<char>::~allocator(&local_c9);
  JSONWriter::StartArray((JSONWriter *)ai_local,false);
  for (local_d0 = 0; local_d0 < paStack_18->mNumChannels; local_d0 = local_d0 + 1) {
    Write((JSONWriter *)ai_local,paStack_18->mChannels[local_d0],true);
  }
  JSONWriter::EndArray((JSONWriter *)ai_local);
  JSONWriter::EndObj((JSONWriter *)ai_local);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiAnimation& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mName);

    out.Key("tickspersecond");
    out.SimpleValue(ai.mTicksPerSecond);

    out.Key("duration");
    out.SimpleValue(ai.mDuration);

    out.Key("channels");
    out.StartArray();
    for (unsigned int n = 0; n < ai.mNumChannels; ++n) {
        Write(out, *ai.mChannels[n]);
    }
    out.EndArray();
    out.EndObj();
}